

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_udata.c
# Opt level: O2

void * lj_lightud_intern(lua_State *L,void *p)

{
  long lVar1;
  byte bVar2;
  void *p_00;
  GCSize nsz;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar8 = (ulong)(L->glref).ptr32;
  uVar7 = (uint)((ulong)p >> 0x20) & 0xffffff80;
  p_00 = (void *)(ulong)*(uint *)(uVar8 + 0x88);
  bVar2 = *(byte *)(uVar8 + 0x5b);
  uVar6 = (uint)bVar2;
  if (p_00 == (void *)0x0) {
LAB_00115842:
    if ((uVar6 != 1) &&
       (uVar3 = uVar6 - (uVar6 >> 1 & 0x55),
       uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333),
       ((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) {
      nsz = 8;
      if (uVar6 != 0) {
        nsz = uVar6 * 8;
      }
      p_00 = lj_mem_realloc(L,p_00,uVar6 * 4,nsz);
      *(int *)(uVar8 + 0x88) = (int)p_00;
    }
    *(char *)(uVar8 + 0x5b) = (char)uVar6;
    uVar4 = (ulong)uVar6;
    *(uint *)((long)p_00 + uVar4 * 4) = uVar7;
  }
  else {
    uVar6 = bVar2 + 1;
    uVar5 = 0xffffffffffffffff;
    do {
      if (bVar2 == uVar5) {
        if (0xfd < bVar2) {
          lj_err_msg(L,LJ_ERR_BADLU);
        }
        goto LAB_00115842;
      }
      uVar4 = uVar5 + 1;
      lVar1 = uVar5 * 4;
      uVar5 = uVar4;
    } while (*(uint *)((long)p_00 + lVar1 + 4) != uVar7);
  }
  return (void *)((ulong)p & 0x7fffffffff | uVar4 << 0x27);
}

Assistant:

void *lj_lightud_intern(lua_State *L, void *p)
{
  global_State *g = G(L);
  uint64_t u = (uint64_t)p;
  uint32_t up = lightudup(u);
  uint32_t *segmap = mref(g->gc.lightudseg, uint32_t);
  MSize segnum = g->gc.lightudnum;
  if (segmap) {
    MSize seg;
    for (seg = 0; seg <= segnum; seg++)
      if (segmap[seg] == up)  /* Fast path. */
	return (void *)(((uint64_t)seg << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
    segnum++;
    /* Leave last segment unused to avoid clash with ITERN key. */
    if (segnum >= (1 << LJ_LIGHTUD_BITS_SEG)-1) lj_err_msg(L, LJ_ERR_BADLU);
  }
  if (!((segnum-1) & segnum) && segnum != 1) {
    lj_mem_reallocvec(L, segmap, segnum, segnum ? 2*segnum : 2u, uint32_t);
    setmref(g->gc.lightudseg, segmap);
  }
  g->gc.lightudnum = segnum;
  segmap[segnum] = up;
  return (void *)(((uint64_t)segnum << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
}